

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O2

list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
* __thiscall
coinscachepair_tests::CreatePairs_abi_cxx11_
          (list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
           *__return_storage_ptr__,coinscachepair_tests *this,CoinsCachePair *sentinel)

{
  CoinsCachePair *self;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> _Var1;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> _Var2;
  iterator in_R8;
  iterator pvVar3;
  _List_node_base **in_R9;
  CoinsCachePair **ppCVar4;
  _List_node_base **pp_Var5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  CoinsCachePair *local_c8;
  _List_node_base *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node._M_size = 0;
  iVar6 = 4;
  while( true ) {
    iVar7 = iVar6 + -1;
    if (iVar6 == 0) break;
    std::__cxx11::
    list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
    ::emplace_back<>(__return_storage_ptr__);
    _Var1 = std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>
                      ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>)
                       __return_storage_ptr__,1);
    self = (CoinsCachePair *)(_Var1._M_node + 1);
    CCoinsCacheEntry::AddFlags
              ((CCoinsCacheEntry *)&_Var1._M_node[3]._M_prev,'\x01',self,(CoinsCachePair *)this);
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x18;
    file.m_begin = (iterator)&local_48;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    local_70 = 0;
    local_78 = &PTR__lazy_ostream_011480b0;
    local_68 = boost::unit_test::lazy_ostream::inst;
    local_60 = "";
    local_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_80 = "";
    local_c8 = (CoinsCachePair *)CONCAT71(local_c8._1_7_,*(undefined1 *)&_Var1._M_node[4]._M_prev);
    local_c0 = (_List_node_base *)CONCAT44(local_c0._4_4_,1);
    pvVar3 = (iterator)0x2;
    ppCVar4 = &local_c8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
              (&local_78,&local_88,0x18,1,2,ppCVar4,"node->second.GetFlags()",&local_c0,
               "CCoinsCacheEntry::DIRTY");
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_90 = "";
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x19;
    file_00.m_begin = (iterator)&local_98;
    msg_00.m_end = (iterator)ppCVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_a8,
               msg_00);
    local_70 = 0;
    local_78 = &PTR__lazy_ostream_011480b0;
    local_68 = boost::unit_test::lazy_ostream::inst;
    local_60 = "";
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_b0 = "";
    local_c0 = _Var1._M_node[4]._M_next;
    pvVar3 = (iterator)0x2;
    pp_Var5 = &local_c0;
    local_c8 = (CoinsCachePair *)this;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (&local_78,&local_b8,0x19,1,2,pp_Var5,"node->second.Next()",&local_c8,"&sentinel");
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = &DAT_0000001a;
    file_01.m_begin = (iterator)&local_d8;
    msg_01.m_end = (iterator)pp_Var5;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e8,
               msg_01);
    local_70 = 0;
    local_78 = &PTR__lazy_ostream_011480b0;
    local_68 = boost::unit_test::lazy_ostream::inst;
    local_60 = "";
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_f0 = "";
    local_c0 = *(_List_node_base **)(this + 0x28);
    in_R8 = (iterator)0x2;
    in_R9 = &local_c0;
    local_c8 = self;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (&local_78,&local_f8,0x1a,1,2,in_R9,"sentinel.second.Prev()",&local_c8,"&(*node)");
    bVar8 = iVar6 != 4;
    iVar6 = iVar7;
    if (bVar8) {
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_100 = "";
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x1d;
      file_02.m_begin = (iterator)&local_108;
      msg_02.m_end = (iterator)in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_118,
                 msg_02);
      local_70 = 0;
      local_78 = &PTR__lazy_ostream_011480b0;
      local_68 = boost::unit_test::lazy_ostream::inst;
      local_60 = "";
      local_128 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_120 = "";
      _Var2 = std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>(_Var1,1);
      local_c0 = _Var2._M_node[4]._M_next;
      pvVar3 = (iterator)0x2;
      pp_Var5 = &local_c0;
      local_c8 = self;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                (&local_78,&local_128,0x1d,1,2,pp_Var5,"std::prev(node)->second.Next()",&local_c8,
                 "&(*node)");
      local_138 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_130 = "";
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1e;
      file_03.m_begin = (iterator)&local_138;
      msg_03.m_end = (iterator)pp_Var5;
      msg_03.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_148,
                 msg_03);
      local_70 = 0;
      local_78 = &PTR__lazy_ostream_011480b0;
      local_68 = boost::unit_test::lazy_ostream::inst;
      local_60 = "";
      local_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_150 = "";
      local_c0 = _Var1._M_node[3]._M_prev;
      _Var1 = std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>(_Var1,1);
      local_c8 = (CoinsCachePair *)(_Var1._M_node + 1);
      in_R8 = (iterator)0x2;
      in_R9 = &local_c0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                (&local_78,&local_158,0x1e,1,2,in_R9,"node->second.Prev()",&local_c8,
                 "&(*std::prev(node))");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::list<CoinsCachePair> CreatePairs(CoinsCachePair& sentinel)
{
    std::list<CoinsCachePair> nodes;
    for (auto i{0}; i < NUM_NODES; ++i) {
        nodes.emplace_back();

        auto node{std::prev(nodes.end())};
        node->second.AddFlags(CCoinsCacheEntry::DIRTY, *node, sentinel);

        BOOST_CHECK_EQUAL(node->second.GetFlags(), CCoinsCacheEntry::DIRTY);
        BOOST_CHECK_EQUAL(node->second.Next(), &sentinel);
        BOOST_CHECK_EQUAL(sentinel.second.Prev(), &(*node));

        if (i > 0) {
            BOOST_CHECK_EQUAL(std::prev(node)->second.Next(), &(*node));
            BOOST_CHECK_EQUAL(node->second.Prev(), &(*std::prev(node)));
        }
    }
    return nodes;
}